

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithMapBufferRangeCase::init
          (ModifyAfterWithMapBufferRangeCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  EVP_PKEY_CTX *ctx_00;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8 [3];
  MessageBuilder local_190;
  ModifyAfterWithMapBufferRangeCase *local_10;
  ModifyAfterWithMapBufferRangeCase *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->
                       super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                       ).
                       super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                       .super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_190,
                      (char (*) [112])
                      "Testing performance of MapBufferRange() command after a draw command that sources data from the target buffer.\n"
                     );
  local_1a8[0] = "Whole buffer is mapped.\n";
  if ((this->m_partialUpload & 1U) != 0) {
    local_1a8[0] = "Half of the buffer is mapped.\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1a8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [11])"Map bits:\n");
  local_1b0 = "";
  if ((this->m_mapFlags & 2) != 0) {
    local_1b0 = "\tGL_MAP_WRITE_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1b0);
  local_1b8 = "";
  if ((this->m_mapFlags & 1) != 0) {
    local_1b8 = "\tGL_MAP_READ_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1b8);
  local_1c0 = "";
  if ((this->m_mapFlags & 4) != 0) {
    local_1c0 = "\tGL_MAP_INVALIDATE_RANGE_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1c0);
  local_1c8 = "";
  if ((this->m_mapFlags & 8) != 0) {
    local_1c8 = "\tGL_MAP_INVALIDATE_BUFFER_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1c8);
  local_1d0 = "";
  if ((this->m_mapFlags & 0x20) != 0) {
    local_1d0 = "\tGL_MAP_UNSYNCHRONIZED_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d0);
  local_1d8 = "";
  if ((this->m_mapFlags & 0x10) != 0) {
    local_1d8 = "\tGL_MAP_FLUSH_EXPLICIT_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d8);
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  iVar1 = ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
          ::init(&this->
                  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void ModifyAfterWithMapBufferRangeCase::init (void)
{
	// Log the purpose of the test

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing performance of MapBufferRange() command after a draw command that sources data from the target buffer.\n"
		<< ((m_partialUpload) ?
			("Half of the buffer is mapped.\n") :
			("Whole buffer is mapped.\n"))
		<< "Map bits:\n"
		<< ((m_mapFlags & GL_MAP_WRITE_BIT) ? ("\tGL_MAP_WRITE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_READ_BIT) ? ("\tGL_MAP_READ_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_RANGE_BIT) ? ("\tGL_MAP_INVALIDATE_RANGE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_BUFFER_BIT) ? ("\tGL_MAP_INVALIDATE_BUFFER_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_UNSYNCHRONIZED_BIT) ? ("\tGL_MAP_UNSYNCHRONIZED_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_FLUSH_EXPLICIT_BIT) ? ("\tGL_MAP_FLUSH_EXPLICIT_BIT\n") : (""))
		<< tcu::TestLog::EndMessage;

	ModifyAfterBasicCase<MapBufferRangeDurationNoAlloc>::init();
}